

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeSelect<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined8 *puVar1;
  _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
  *res_00;
  undefined1 local_a0 [8];
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> res;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  results<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_a0,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                     *)((long)&res.val.
                               super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                       + 0x20),
                    (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                     *)local_a0);
  if (_val.val.
      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
      '\x02') {
    _val.val.
    super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
               ),res.val.
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_
               ,_val.val.
                super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
                _0_8_ + res.val.
                        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                        ._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ ==
        &local_40) {
      *puVar1 = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           _val.val.
           super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(uStack_3f,local_40);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
    local_40 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    _val.val.
    super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._32_8_ = &local_40;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)((long)&res.val.
                                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           + 0x20));
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)((long)&res.val.
                                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           + 0x20));
    res_00 = (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
              *)0x0;
    if (res.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\0') {
      res_00 = (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                *)local_a0;
    }
    ParseDefsCtx::makeSelect
              (__return_storage_ptr__,ctx,pos,annotations,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)res_00);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeSelect(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto res = results(ctx);
  CHECK_ERR(res);
  return ctx.makeSelect(pos, annotations, res.getPtr());
}